

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stage2RunnerNonRecursive.hpp
# Opt level: O0

void __thiscall
Centaurus::Stage2Runner::Stage2Runner
          (Stage2Runner *this,char *filename,size_t bank_size,int bank_num,int master_pid,
          void *context,atomic<int> *counter)

{
  void *context_local;
  int master_pid_local;
  int bank_num_local;
  size_t bank_size_local;
  char *filename_local;
  Stage2Runner *this_local;
  
  NonRecursiveReductionRunner::NonRecursiveReductionRunner
            (&this->super_NonRecursiveReductionRunner,filename,bank_size,bank_num,master_pid,context
             ,counter);
  (this->super_NonRecursiveReductionRunner).super_BaseRunner.super_BaseListener._vptr_BaseListener =
       (_func_int **)&PTR__Stage2Runner_0028f388;
  BaseRunner::acquire_memory((BaseRunner *)this,false);
  BaseRunner::open_semaphore((BaseRunner *)this);
  return;
}

Assistant:

Stage2Runner(const char *filename, size_t bank_size, int bank_num, int master_pid, void *context = nullptr, std::atomic<int> *counter = nullptr)
    : NonRecursiveReductionRunner(filename, bank_size, bank_num, master_pid, context, counter)
  {
    acquire_memory(false);
    open_semaphore();
  }